

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiexsas.c
# Opt level: O2

HTTPAPIEX_SAS_HANDLE
HTTPAPIEX_SAS_Create(STRING_HANDLE key,STRING_HANDLE uriResource,STRING_HANDLE keyName)

{
  int iVar1;
  char *pcVar2;
  char *uriResource_00;
  char *keyName_00;
  HTTPAPIEX_SAS_STATE *pHVar3;
  LOGGER_LOG p_Var4;
  
  if (key == (STRING_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (HTTPAPIEX_SAS_HANDLE)0x0;
    }
    pcVar2 = "No key passed to HTTPAPIEX_SAS_Create.";
    iVar1 = 0x57;
  }
  else {
    if (uriResource != (STRING_HANDLE)0x0) {
      pcVar2 = STRING_c_str(key);
      uriResource_00 = STRING_c_str(uriResource);
      keyName_00 = STRING_c_str(keyName);
      pHVar3 = construct_httpex_sas(pcVar2,uriResource_00,keyName_00);
      return pHVar3;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return (HTTPAPIEX_SAS_HANDLE)0x0;
    }
    pcVar2 = "No uri resource passed to HTTPAPIEX_SAS_Create.";
    iVar1 = 0x5c;
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/httpapiexsas.c"
            ,"HTTPAPIEX_SAS_Create",iVar1,1,pcVar2);
  return (HTTPAPIEX_SAS_HANDLE)0x0;
}

Assistant:

HTTPAPIEX_SAS_HANDLE HTTPAPIEX_SAS_Create(STRING_HANDLE key, STRING_HANDLE uriResource, STRING_HANDLE keyName)
{
    HTTPAPIEX_SAS_HANDLE result = NULL;
    if (key == NULL)
    {
        /*Codes_SRS_HTTPAPIEXSAS_06_001: [If the parameter key is NULL then HTTPAPIEX_SAS_Create shall return NULL.]*/
        LogError("No key passed to HTTPAPIEX_SAS_Create.");
    }
    else if (uriResource == NULL)
    {
        /*Codes_SRS_HTTPAPIEXSAS_06_002: [If the parameter uriResource is NULL then HTTPAPIEX_SAS_Create shall return NULL.]*/
        LogError("No uri resource passed to HTTPAPIEX_SAS_Create.");
    }
    else
    {
        /*Codes_SRS_HTTPAPIEXSAS_06_003: [The parameter keyName for HTTPAPIEX_SAS_Create is optional and can be NULL.]*/
        /*Codes_SRS_HTTPAPIEXSAS_01_001: [ HTTPAPIEX_SAS_Create shall create a new instance of HTTPAPIEX_SAS and return a non-NULL handle to it. ]*/
        const char* keyStr = STRING_c_str(key);
        const char* uriStr = STRING_c_str(uriResource);
        const char* keyNameStr = STRING_c_str(keyName);
        result = construct_httpex_sas(keyStr, uriStr, keyNameStr);
    }
    return result;
}